

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_tri_jac_dquality_dnode0
          (REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_428;
  double local_418;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT j;
  REF_INT i;
  REF_DBL dl2 [3];
  REF_DBL da [3];
  REF_DBL local_3a8;
  REF_DBL l2;
  REF_DBL a;
  REF_DBL dn [3] [3];
  REF_DBL local_348;
  REF_DBL de2 [3] [3];
  REF_DBL local_2f8;
  REF_DBL de1 [3] [3];
  REF_DBL n [3];
  double local_288;
  REF_DBL e2 [3];
  double local_268;
  REF_DBL e1 [3];
  double local_248;
  REF_DBL e0 [3];
  REF_DBL dxyz0 [3] [3];
  REF_DBL local_1d8;
  REF_DBL xyz2 [3];
  REF_DBL local_1b8;
  REF_DBL xyz1 [3];
  REF_DBL local_198;
  REF_DBL xyz0 [3];
  REF_DBL local_178;
  REF_DBL jac [9];
  REF_DBL local_128;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog2 [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  REF_DBL *d_quality_local;
  REF_DBL *quality_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,*nodes,mlog1 + 5);
  if (ref_node_local._4_4_ == 0) {
    ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[1],mlog2 + 5);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[2],mlog + 5);
      if (ref_node_local._4_4_ == 0) {
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 6;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          m[(long)ref_private_macro_code_rss + 5] =
               (mlog1[(long)ref_private_macro_code_rss + 5] +
                mlog2[(long)ref_private_macro_code_rss + 5] +
               mlog[(long)ref_private_macro_code_rss + 5]) / 3.0;
        }
        ref_node_local._4_4_ = ref_matrix_exp_m(m + 5,&local_128);
        if (ref_node_local._4_4_ == 0) {
          ref_node_local._4_4_ = ref_matrix_jacob_m(&local_128,&local_178);
          if (ref_node_local._4_4_ == 0) {
            ref_node_local._4_4_ =
                 ref_matrix_vect_mult(&local_178,ref_node->real + *nodes * 0xf,&local_198);
            if (ref_node_local._4_4_ == 0) {
              ref_node_local._4_4_ =
                   ref_matrix_vect_mult(&local_178,ref_node->real + nodes[1] * 0xf,&local_1b8);
              if (ref_node_local._4_4_ == 0) {
                ref_node_local._4_4_ =
                     ref_matrix_vect_mult(&local_178,ref_node->real + nodes[2] * 0xf,&local_1d8);
                if (ref_node_local._4_4_ == 0) {
                  dxyz0[0][0] = jac[0];
                  dxyz0[0][1] = jac[1];
                  dxyz0[0][2] = jac[2];
                  dxyz0[1][0] = jac[3];
                  dxyz0[1][1] = jac[4];
                  dxyz0[1][2] = jac[5];
                  dxyz0[2][0] = jac[6];
                  dxyz0[2][1] = jac[7];
                  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
                      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                    e0[(long)ref_private_macro_code_rss + -1] =
                         xyz2[(long)ref_private_macro_code_rss + -1] -
                         xyz1[(long)ref_private_macro_code_rss + -1];
                  }
                  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
                      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                    e1[(long)ref_private_macro_code_rss + -1] =
                         xyz0[(long)ref_private_macro_code_rss + -1] -
                         xyz2[(long)ref_private_macro_code_rss + -1];
                  }
                  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
                      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                    e2[(long)ref_private_macro_code_rss + -1] =
                         xyz1[(long)ref_private_macro_code_rss + -1] -
                         xyz0[(long)ref_private_macro_code_rss + -1];
                  }
                  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
                      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                      de1[(long)ref_private_macro_code_rss + -1]
                      [(long)ref_private_macro_code_rss_1 + 2] =
                           dxyz0[(long)ref_private_macro_code_rss + -1]
                           [(long)ref_private_macro_code_rss_1 + 2];
                    }
                  }
                  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
                      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                      de2[(long)ref_private_macro_code_rss + -1]
                      [(long)ref_private_macro_code_rss_1 + 2] =
                           -dxyz0[(long)ref_private_macro_code_rss + -1]
                            [(long)ref_private_macro_code_rss_1 + 2];
                    }
                  }
                  dVar1 = e2[0] * e0[1] + -(e2[1] * e0[0]);
                  dVar2 = e2[1] * local_248 + -(local_288 * e0[1]);
                  dVar3 = local_288 * e0[0] + -(e2[0] * local_248);
                  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    dn[-1][(long)ref_private_macro_code_rss_1 + 2] =
                         de2[0][(long)ref_private_macro_code_rss_1 + 2] * e0[1] +
                         -(de2[1][(long)ref_private_macro_code_rss_1 + 2] * e0[0]);
                    dn[0][(long)ref_private_macro_code_rss_1 + 2] =
                         de2[1][(long)ref_private_macro_code_rss_1 + 2] * local_248 +
                         -(de2[-1][(long)ref_private_macro_code_rss_1 + 2] * e0[1]);
                    dn[1][(long)ref_private_macro_code_rss_1 + 2] =
                         de2[-1][(long)ref_private_macro_code_rss_1 + 2] * e0[0] +
                         -(de2[0][(long)ref_private_macro_code_rss_1 + 2] * local_248);
                  }
                  dVar4 = e0[1] * e0[1] + local_248 * local_248 + e0[0] * e0[0] +
                          e1[1] * e1[1] + local_268 * local_268 + e1[0] * e1[0] +
                          e2[1] * e2[1] + local_288 * local_288 + e2[0] * e2[0];
                  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    *(double *)(&j + (long)ref_private_macro_code_rss_1 * 2) =
                         e2[1] * 2.0 * de2[1][(long)ref_private_macro_code_rss_1 + 2] +
                         e2[0] * 2.0 * de2[0][(long)ref_private_macro_code_rss_1 + 2] +
                         local_288 * 2.0 * de2[-1][(long)ref_private_macro_code_rss_1 + 2] +
                         e1[1] * 2.0 * de1[1][(long)ref_private_macro_code_rss_1 + 2] +
                         local_268 * 2.0 * de1[-1][(long)ref_private_macro_code_rss_1 + 2] +
                         e1[0] * 2.0 * de1[0][(long)ref_private_macro_code_rss_1 + 2];
                  }
                  dVar5 = sqrt(dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2);
                  dVar5 = dVar5 * 0.5;
                  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    dVar6 = sqrt(dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2);
                    da[(long)ref_private_macro_code_rss_1 + -1] =
                         (0.25 / dVar6) *
                         (dVar3 * 2.0 * dn[1][(long)ref_private_macro_code_rss_1 + 2] +
                         dVar1 * 2.0 * dn[-1][(long)ref_private_macro_code_rss_1 + 2] +
                         dVar2 * 2.0 * dn[0][(long)ref_private_macro_code_rss_1 + 2]);
                  }
                  if (dVar4 * 1e+20 <= 0.0) {
                    local_418 = -(dVar4 * 1e+20);
                  }
                  else {
                    local_418 = dVar4 * 1e+20;
                  }
                  local_428 = dVar5;
                  if (dVar5 <= 0.0) {
                    local_428 = -dVar5;
                  }
                  if (local_418 <= local_428) {
                    *quality = -1.0;
                  }
                  else {
                    dVar1 = sqrt(3.0);
                    *quality = dVar1 * 4.0 * (dVar5 / dVar4);
                    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                      dVar1 = sqrt(3.0);
                      d_quality[ref_private_macro_code_rss_1] =
                           ((dVar1 * 4.0 *
                            (da[(long)ref_private_macro_code_rss_1 + -1] * dVar4 +
                            -(dVar5 * *(double *)(&j + (long)ref_private_macro_code_rss_1 * 2)))) /
                           dVar4) / dVar4;
                    }
                  }
                  ref_node_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x85f,"ref_node_tri_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,
                         "xyz2");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x85d,"ref_node_tri_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"xyz1")
                ;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x85b,"ref_node_tri_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"xyz0");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x858,"ref_node_tri_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"jac");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x857,"ref_node_tri_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"exp");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x855,"ref_node_tri_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"log2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x854,
             "ref_node_tri_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"log1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x853,
           "ref_node_tri_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"log0");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_node_tri_jac_dquality_dnode0(REF_NODE ref_node,
                                                           REF_INT *nodes,
                                                           REF_DBL *quality,
                                                           REF_DBL *d_quality) {
  REF_DBL mlog0[6], mlog1[6], mlog2[6];
  REF_DBL mlog[6], m[6], jac[9];
  REF_DBL xyz0[3], xyz1[3], xyz2[3];
  REF_DBL dxyz0[3][3];
  REF_DBL e0[3], e1[3], e2[3], n[3];
  REF_DBL de1[3][3], de2[3][3], dn[3][3];
  REF_DBL a, l2, da[3], dl2[3];
  REF_INT i, j;

  RSS(ref_node_metric_get_log(ref_node, nodes[0], mlog0), "log0");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], mlog1), "log1");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], mlog2), "log2");
  for (i = 0; i < 6; i++) mlog[i] = (mlog0[i] + mlog1[i] + mlog2[i]) / 3.0;
  RSS(ref_matrix_exp_m(mlog, m), "exp");
  RSS(ref_matrix_jacob_m(m, jac), "jac");

  RSS(ref_matrix_vect_mult(jac, ref_node_xyz_ptr(ref_node, nodes[0]), xyz0),
      "xyz0");
  RSS(ref_matrix_vect_mult(jac, ref_node_xyz_ptr(ref_node, nodes[1]), xyz1),
      "xyz1");
  RSS(ref_matrix_vect_mult(jac, ref_node_xyz_ptr(ref_node, nodes[2]), xyz2),
      "xyz2");

  dxyz0[0][0] = jac[0];
  dxyz0[0][1] = jac[1];
  dxyz0[0][2] = jac[2];

  dxyz0[1][0] = jac[3];
  dxyz0[1][1] = jac[4];
  dxyz0[1][2] = jac[5];

  dxyz0[2][0] = jac[6];
  dxyz0[2][1] = jac[7];
  dxyz0[2][2] = jac[8];

  for (i = 0; i < 3; i++) e0[i] = xyz2[i] - xyz1[i];
  for (i = 0; i < 3; i++) e1[i] = xyz0[i] - xyz2[i];
  for (i = 0; i < 3; i++) e2[i] = xyz1[i] - xyz0[i];

  for (i = 0; i < 3; i++)
    for (j = 0; j < 3; j++) de1[i][j] = dxyz0[i][j];
  for (i = 0; i < 3; i++)
    for (j = 0; j < 3; j++) de2[i][j] = -dxyz0[i][j];

  ref_math_cross_product(e2, e0, n);
  for (j = 0; j < 3; j++) {
    dn[0][j] = de2[1][j] * e0[2] - de2[2][j] * e0[1];
    dn[1][j] = de2[2][j] * e0[0] - de2[0][j] * e0[2];
    dn[2][j] = de2[0][j] * e0[1] - de2[1][j] * e0[0];
  }

  l2 = ref_math_dot(e0, e0) + ref_math_dot(e1, e1) + ref_math_dot(e2, e2);

  for (j = 0; j < 3; j++)
    dl2[j] = 2.0 * e1[0] * de1[0][j] + 2.0 * e1[1] * de1[1][j] +
             2.0 * e1[2] * de1[2][j] + 2.0 * e2[0] * de2[0][j] +
             2.0 * e2[1] * de2[1][j] + 2.0 * e2[2] * de2[2][j];

  a = 0.5 * sqrt(ref_math_dot(n, n));

  for (j = 0; j < 3; j++)
    da[j] =
        0.5 * 0.5 / sqrt(ref_math_dot(n, n)) *
        (2.0 * n[0] * dn[0][j] + 2.0 * n[1] * dn[1][j] + 2.0 * n[2] * dn[2][j]);

  if (ref_math_divisible(a, l2)) {
    *quality = 4.0 * sqrt(3.0) * (a / l2);
    for (j = 0; j < 3; j++)
      d_quality[j] = 4.0 * sqrt(3.0) * (da[j] * l2 - a * dl2[j]) / l2 / l2;
  } else {
    /* printf("%s: %d: %s: div zero area %.18e l2 %.18e\n", __FILE__, __LINE__,
       __func__, a, l2); */
    *quality = -1.0;
  }

  return REF_SUCCESS;
}